

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O0

FuncVec * __thiscall
dg::llvmdg::LazyLLVMCallGraph::getCalledFunctions(LazyLLVMCallGraph *this,CallInst *C)

{
  bool bVar1;
  int iVar2;
  Value *C_00;
  BasicBlock *this_00;
  pointer ppVar3;
  LazyLLVMCallGraph *in_RSI;
  LazyLLVMCallGraph *in_RDI;
  iterator it;
  Function *fun;
  Value *val;
  CallInst *in_stack_ffffffffffffff98;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *in_stack_ffffffffffffffa8
  ;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *in_stack_ffffffffffffffb0
  ;
  Function **in_stack_ffffffffffffffb8;
  _Node_iterator_base<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_false>
  in_stack_ffffffffffffffc0;
  _Node_iterator_base<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_false>
  local_38;
  Function *local_30;
  ret_type local_28;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *local_8;
  
  C_00 = _getCalledValue(in_RDI,in_stack_ffffffffffffff98);
  local_28 = llvm::dyn_cast<llvm::Function,llvm::Value_const>((Value *)in_RDI);
  if (local_28 == (ret_type)0x0) {
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<const_llvm::CallInst_*,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>_>
         ::find((unordered_map<const_llvm::CallInst_*,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>_>
                 *)in_stack_ffffffffffffff98,(key_type *)0x1870a6);
    std::
    unordered_map<const_llvm::CallInst_*,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>_>
    ::end((unordered_map<const_llvm::CallInst_*,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>_>
           *)in_stack_ffffffffffffff98);
    bVar1 = std::__detail::operator!=
                      (&local_38,
                       (_Node_iterator_base<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_false>
                        *)&stack0xffffffffffffffc0);
    if (bVar1) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_false,_false>
                             *)0x1870dd);
      local_8 = &ppVar3->second;
    }
    else {
      _getCalledFunctions(in_RSI,(CallInst *)C_00);
      std::
      unordered_map<const_llvm::CallInst_*,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>_>
      ::operator[]((unordered_map<const_llvm::CallInst_*,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>_>
                    *)in_RDI,(key_type *)in_stack_ffffffffffffff98);
      std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::operator=
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::~vector
                (in_stack_ffffffffffffffb0);
      local_8 = std::
                unordered_map<const_llvm::CallInst_*,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>_>
                ::operator[]((unordered_map<const_llvm::CallInst_*,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>_>
                              *)in_RDI,(key_type *)in_stack_ffffffffffffff98);
    }
  }
  else {
    if (getCalledFunctions(llvm::CallInst_const*)::retval == '\0') {
      iVar2 = __cxa_guard_acquire(&getCalledFunctions(llvm::CallInst_const*)::retval);
      if (iVar2 != 0) {
        std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::vector
                  ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
                   0x187008);
        __cxa_atexit(std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::
                     ~vector,&getCalledFunctions::retval,&__dso_handle);
        __cxa_guard_release(&getCalledFunctions(llvm::CallInst_const*)::retval);
      }
    }
    std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::clear
              ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)0x18703a);
    std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::push_back
              (in_stack_ffffffffffffffb0,(value_type *)in_stack_ffffffffffffffa8);
    this_00 = llvm::Instruction::getParent((Instruction *)in_RSI);
    local_30 = llvm::BasicBlock::getParent(this_00);
    GenericCallGraph<const_llvm::Function_*>::addCall
              ((GenericCallGraph<const_llvm::Function_*> *)in_stack_ffffffffffffffc0._M_cur,
               in_stack_ffffffffffffffb8,(Function **)in_stack_ffffffffffffffb0);
    local_8 = &getCalledFunctions::retval;
  }
  return local_8;
}

Assistant:

const FuncVec &getCalledFunctions(const llvm::CallInst *C) {
        auto *val = _getCalledValue(C);
        if (auto *fun = llvm::dyn_cast<llvm::Function>(val)) {
            static FuncVec retval;
            retval.clear();
            retval.push_back(fun);
            _cg.addCall(C->getParent()->getParent(), fun);
            return retval;
        }

        auto it = _funptrs.find(C);
        if (it != _funptrs.end()) {
            return it->second;
        }

        // FIXME: do not do multiple lookups
        _funptrs[C] = _getCalledFunctions(C);
        return _funptrs[C];
    }